

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

void __thiscall glcts::LayoutBindingBaseCase::teardownTest(LayoutBindingBaseCase *this)

{
  Texture2DArray *this_00;
  Texture3D *this_01;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  _Self local_50;
  _Self local_48;
  iterator it_2;
  _Self local_38;
  _Self local_30;
  iterator it_1;
  _Self local_20;
  _Self local_18;
  iterator it;
  LayoutBindingBaseCase *this_local;
  
  it._M_node = (_Base_ptr)this;
  local_18._M_node =
       (_Base_ptr)
       std::
       map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
       ::begin(&this->m_textures2D);
  while( true ) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
         ::end(&this->m_textures2D);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture2D_*>_>::operator->(&local_18);
    if (ppVar2->second != (Texture2D *)0x0) {
      (*ppVar2->second->_vptr_Texture2D[1])();
    }
    it_1._M_node = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture2D_*>_>::operator++
                             (&local_18,0);
  }
  std::
  map<int,_glu::Texture2D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2D_*>_>_>
  ::clear(&this->m_textures2D);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
       ::begin(&this->m_textures2DArray);
  while( true ) {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
         ::end(&this->m_textures2DArray);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture2DArray_*>_>::operator->
                       (&local_30);
    this_00 = ppVar3->second;
    if (this_00 != (Texture2DArray *)0x0) {
      glu::Texture2DArray::~Texture2DArray(this_00);
      operator_delete(this_00,0x70);
    }
    it_2._M_node = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture2DArray_*>_>::operator++
                             (&local_30,0);
  }
  std::
  map<int,_glu::Texture2DArray_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture2DArray_*>_>_>
  ::clear(&this->m_textures2DArray);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
       ::begin(&this->m_textures3D);
  while( true ) {
    local_50._M_node =
         (_Base_ptr)
         std::
         map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
         ::end(&this->m_textures3D);
    bVar1 = std::operator!=(&local_48,&local_50);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture3D_*>_>::operator->(&local_48);
    this_01 = ppVar4->second;
    if (this_01 != (Texture3D *)0x0) {
      glu::Texture3D::~Texture3D(this_01);
      operator_delete(this_01,0x70);
    }
    std::_Rb_tree_iterator<std::pair<const_int,_glu::Texture3D_*>_>::operator++(&local_48,0);
  }
  std::
  map<int,_glu::Texture3D_*,_std::less<int>,_std::allocator<std::pair<const_int,_glu::Texture3D_*>_>_>
  ::clear(&this->m_textures3D);
  return;
}

Assistant:

virtual void teardownTest()
	{
		for (Texture2DMap::iterator it = m_textures2D.begin(); it != m_textures2D.end(); it++)
		{
			delete it->second;
		}
		m_textures2D.clear();

		for (Texture2DArrayMap::iterator it = m_textures2DArray.begin(); it != m_textures2DArray.end(); it++)
		{
			delete it->second;
		}
		m_textures2DArray.clear();

		for (Texture3DMap::iterator it = m_textures3D.begin(); it != m_textures3D.end(); it++)
		{
			delete it->second;
		}
		m_textures3D.clear();
	}